

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  thread *this;
  socklen_t __len;
  int *local_98;
  undefined1 local_90 [8];
  ThreadPtr Thread;
  int i;
  int serverFd;
  undefined1 local_68 [8];
  Sock server;
  ThreadPool threadsPool;
  char *pcStack_30;
  int opt;
  globalArgs_t globalArgs;
  char **argv_local;
  int argc_local;
  
  if (argc < 6) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," -h <ip> -p <port> -d <directory>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    pcStack_30 = (char *)0x0;
    globalArgs.m_host = (char *)0x0;
    globalArgs.m_directory = (char *)0x100000000;
    threadsPool.threads.
    super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = getopt(argc,argv,main::optString);
    while( true ) {
      if (threadsPool.threads.
          super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == -1) break;
      if (threadsPool.threads.
          super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x44) {
        iVar2 = atoi(_optarg);
        globalArgs.m_directory = (char *)CONCAT44(iVar2,(int)globalArgs.m_directory);
      }
      else if (threadsPool.threads.
               super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 100) {
        globalArgs.m_host = _optarg;
      }
      else if (threadsPool.threads.
               super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x68) {
        pcStack_30 = _optarg;
      }
      else if (threadsPool.threads.
               super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0x70) {
        iVar2 = atoi(_optarg);
        globalArgs.m_directory = (char *)CONCAT44(globalArgs.m_directory._4_4_,iVar2);
      }
      threadsPool.threads.
      super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = getopt(argc,argv,main::optString);
    }
    if (globalArgs.m_directory._4_4_ != 0) {
      daemonize("/tmp",(char *)0x0);
    }
    ThreadPool::ThreadPool((ThreadPool *)&server.m_closeOnDestroy);
    __len = 0;
    Sock::Sock((Sock *)local_68,2,1,0,false);
    iVar2 = Sock::good((Sock *)local_68);
    if ((iVar2 != 0) &&
       (iVar2 = Sock::bind((Sock *)local_68,(int)pcStack_30,
                           (sockaddr *)((ulong)globalArgs.m_directory & 0xffffffff),__len),
       -1 < iVar2)) {
      iVar2 = Sock::setNonblock((Sock *)local_68);
      if (iVar2 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"created server socket for: ");
        poVar4 = std::operator<<(poVar4,"host = ");
        poVar4 = std::operator<<(poVar4,pcStack_30);
        poVar4 = std::operator<<(poVar4," port = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)globalArgs.m_directory);
        poVar4 = std::operator<<(poVar4," directory = ");
        poVar4 = std::operator<<(poVar4,globalArgs.m_host);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        Thread._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
        super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
        super__Head_base<0UL,_std::thread_*,_false>._M_head_impl._4_4_ = Sock::fd((Sock *)local_68);
        for (Thread._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
             super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
             super__Head_base<0UL,_std::thread_*,_false>._M_head_impl._0_4_ = 0;
            uVar1 = (uint)Thread._M_t.
                          super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
                          super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
                          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl,
            uVar3 = std::thread::hardware_concurrency(), uVar1 < uVar3;
            Thread._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
            super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
            super__Head_base<0UL,_std::thread_*,_false>._M_head_impl._0_4_ =
                 (uint)Thread._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>.
                       _M_t.super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
                       super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 1) {
          this = (thread *)operator_new(8);
          local_98 = (int *)((long)&Thread._M_t.
                                    super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>
                                    .super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 4);
          std::thread::thread<void(&)(void*),int*,void>(this,clientRead,&local_98);
          std::unique_ptr<std::thread,void(*const)(std::thread*)>::
          unique_ptr<void(*const)(std::thread*),void>
                    ((unique_ptr<std::thread,void(*const)(std::thread*)> *)local_90,this,
                     &ThreadPool::ThreadDeleter);
          std::
          vector<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
          ::push_back((vector<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
                       *)&server.m_closeOnDestroy,(value_type *)local_90);
          std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>::~unique_ptr
                    ((unique_ptr<std::thread,_void_(*const)(std::thread_*)> *)local_90);
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"cannot set for server socket nonblock mode")
        ;
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
    Sock::~Sock((Sock *)local_68);
    ThreadPool::~ThreadPool((ThreadPool *)&server.m_closeOnDestroy);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 6)
  {
    std::cerr << "usage: " << argv[0] << " -h <ip> -p <port> -d <directory>" << std::endl;
    return 0;
  }

  globalArgs_t globalArgs {nullptr, nullptr, 0, 1};
  static const char* optString = "h:p:d:D:";
  int opt = 0;

  opt = getopt( argc, argv, optString );
  while(opt != -1)
  {
    switch(opt)
    {
      case 'h':
        globalArgs.m_host = optarg;
        break;

      case 'p':
        globalArgs.m_port = atoi(optarg);
        break;

      case 'd':
        globalArgs.m_directory = optarg;
        break;

      case 'D':
      globalArgs.daemonize = atoi(optarg);
      break;

      default:
        break;
    }

    opt = getopt(argc, argv, optString);
  }

  if (globalArgs.daemonize)
    daemonize("/tmp");

  ThreadPool threadsPool;

  /* create a server socket */
  Sock server(AF_INET, SOCK_STREAM);
  if (!server.good())
    return 0;

  if (server.bind(globalArgs.m_host, globalArgs.m_port) < 0)
    return 0;

  if (server.setNonblock() != 0)
  {
    std::cerr << "cannot set for server socket nonblock mode" << std::endl;
    return 0;
  }

  std::cout << "created server socket for: "
            << "host = " << globalArgs.m_host
            << " port = " << globalArgs.m_port
            << " directory = " << globalArgs.m_directory
            << std::endl;

  int serverFd = server.fd();
  for (int i = 0; i < std::thread::hardware_concurrency(); ++i)
  {
    ThreadPool::ThreadPtr Thread(new std::thread(clientRead, &serverFd), ThreadPool::ThreadDeleter);
    threadsPool.threads.push_back(std::move(Thread));
  }

  return 0;
}